

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::CalculateUVCoordinates_MDL5(MDLImporter *this)

{
  aiTexture *paVar1;
  aiMesh *paVar2;
  Logger *this_00;
  uint local_44;
  uint i;
  aiMesh *pcMesh;
  float fHeight;
  float fWidth;
  uint32_t *piPtr;
  uint iHeight;
  uint iWidth;
  aiTexture *pcTex;
  Header *pcHeader;
  MDLImporter *this_local;
  
  if ((*(int *)(this->mBuffer + 0x30) != 0) && (this->pScene->mNumTextures != 0)) {
    paVar1 = *this->pScene->mTextures;
    if (paVar1->mHeight == 0) {
      piPtr._0_4_ = paVar1->pcData[3];
      piPtr._4_4_ = paVar1->pcData[4];
      if ((piPtr._0_4_ == (aiTexel)0x0) || (piPtr._4_4_ == (aiTexel)0x0)) {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,
                     "Either the width or the height of the embedded DDS texture is zero. Unable to compute final texture coordinates. The texture coordinates remain in their original 0-x/0-y (x,y = texture size) range."
                    );
        piPtr._4_1_ = '\x01';
        piPtr._5_1_ = '\0';
        piPtr._6_1_ = '\0';
        piPtr._7_1_ = '\0';
        piPtr._0_1_ = '\x01';
        piPtr._1_1_ = '\0';
        piPtr._2_1_ = '\0';
        piPtr._3_1_ = '\0';
      }
    }
    else {
      piPtr._4_4_ = (aiTexel)paVar1->mWidth;
      piPtr._0_4_ = (aiTexel)paVar1->mHeight;
    }
    if ((piPtr._4_4_ != (aiTexel)0x1) || (piPtr._0_4_ != (aiTexel)0x1)) {
      paVar2 = *this->pScene->mMeshes;
      for (local_44 = 0; local_44 < paVar2->mNumVertices; local_44 = local_44 + 1) {
        paVar2->mTextureCoords[0][local_44].x =
             paVar2->mTextureCoords[0][local_44].x / (float)(uint)piPtr._4_4_;
        paVar2->mTextureCoords[0][local_44].y =
             paVar2->mTextureCoords[0][local_44].y / (float)(uint)piPtr._0_4_;
        paVar2->mTextureCoords[0][local_44].y = 1.0 - paVar2->mTextureCoords[0][local_44].y;
      }
    }
  }
  return;
}

Assistant:

void MDLImporter::CalculateUVCoordinates_MDL5()
{
    const MDL::Header* const pcHeader = (const MDL::Header*)this->mBuffer;
    if (pcHeader->num_skins && this->pScene->mNumTextures)  {
        const aiTexture* pcTex = this->pScene->mTextures[0];

        // if the file is loaded in DDS format: get the size of the
        // texture from the header of the DDS file
        // skip three DWORDs and read first height, then the width
        unsigned int iWidth, iHeight;
        if (!pcTex->mHeight)    {
            const uint32_t* piPtr = (uint32_t*)pcTex->pcData;

            piPtr += 3;
            iHeight = (unsigned int)*piPtr++;
            iWidth  = (unsigned int)*piPtr;
            if (!iHeight || !iWidth)
            {
                ASSIMP_LOG_WARN("Either the width or the height of the "
                    "embedded DDS texture is zero. Unable to compute final texture "
                    "coordinates. The texture coordinates remain in their original "
                    "0-x/0-y (x,y = texture size) range.");
                iWidth  = 1;
                iHeight = 1;
            }
        }
        else    {
            iWidth  = pcTex->mWidth;
            iHeight = pcTex->mHeight;
        }

        if (1 != iWidth || 1 != iHeight)    {
            const float fWidth = (float)iWidth;
            const float fHeight = (float)iHeight;
            aiMesh* pcMesh = this->pScene->mMeshes[0];
            for (unsigned int i = 0; i < pcMesh->mNumVertices;++i)
            {
                pcMesh->mTextureCoords[0][i].x /= fWidth;
                pcMesh->mTextureCoords[0][i].y /= fHeight;
                pcMesh->mTextureCoords[0][i].y = 1.0f - pcMesh->mTextureCoords[0][i].y; // DX to OGL
            }
        }
    }
}